

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall
helics::Input::Input
          (Input *this,ValueFederate *valueFed,InterfaceHandle id,string_view actName,
          string_view unitsOut)

{
  string_view actName_00;
  bool bVar1;
  precise_unit *__args;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  shared_ptr<units::precise_unit> *in_stack_fffffffffffffed8;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Federate *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  Interface *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  allocator<char> local_81 [33];
  precise_unit local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 local_28;
  
  actName_00._M_str = in_stack_ffffffffffffff28;
  actName_00._M_len = in_stack_ffffffffffffff20;
  local_28 = in_RSI;
  Interface::Interface
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffff30 >> 0x20),actName_00);
  *in_RDI = &PTR__Input_00a46e48;
  in_RDI[7] = local_28;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 10) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x54) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  *(undefined1 *)((long)in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x5b) = 0;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined2 *)((long)in_RDI + 0x5e) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = 0;
  __t = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0xe);
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::variant<double_const&,void,void,double,void>
            (in_stack_fffffffffffffee0,(double *)in_stack_fffffffffffffed8);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x14);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x3bfe46);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x3bfe5c);
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::vector((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
            *)0x3bfe72);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  in_RDI[0x1f] = 0xbff0000000000000;
  in_RDI[0x20] = 0;
  std::
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  ::variant((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
             *)0x3bfeb9);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
  if (!bVar1) {
    __a = local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (pbVar2,__t,__a);
    __args = (precise_unit *)::units::getDefaultFlags();
    local_60 = ::units::unit_from_string(pbVar2,(uint64_t)__t);
    std::make_shared<units::precise_unit,units::precise_unit>(__args);
    pbVar2 = &local_50;
    std::shared_ptr<units::precise_unit>::operator=
              ((shared_ptr<units::precise_unit> *)pbVar2,in_stack_fffffffffffffed8);
    std::shared_ptr<units::precise_unit>::~shared_ptr((shared_ptr<units::precise_unit> *)0x3bff81);
    std::__cxx11::string::~string(pbVar2);
    std::allocator<char>::~allocator(local_81);
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pbVar2);
    bVar1 = ::units::is_valid((precise_unit *)
                              CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if (!bVar1) {
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffef0));
    }
  }
  return;
}

Assistant:

Input::Input(ValueFederate* valueFed,
             InterfaceHandle id,
             std::string_view actName,
             std::string_view unitsOut): Interface(valueFed, id, actName), fed(valueFed)
{
    if (!unitsOut.empty()) {
        outputUnits =
            std::make_shared<units::precise_unit>(units::unit_from_string(std::string{unitsOut}));
        if (!units::is_valid(*outputUnits)) {
            outputUnits.reset();
        }
    }
}